

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O0

void display_warning(monst *mon)

{
  char cVar1;
  char cVar2;
  boolean bVar3;
  int iVar4;
  int local_28;
  int local_24;
  int local_20;
  int mflag;
  int monnum;
  int wl;
  int y;
  int x;
  monst *mon_local;
  
  cVar1 = mon->mx;
  cVar2 = mon->my;
  mflag = mon->m_lev / 4;
  if ((((u.uprops[0x18].intrinsic == 0) && (u.uprops[0x18].extrinsic == 0)) ||
      ((*(uint *)&mon->field_0x60 >> 0x16 & 1) != 0)) ||
     (iVar4 = dist2((int)mon->mx,(int)mon->my,(int)u.ux,(int)u.uy), 99 < iVar4)) {
    bVar3 = match_warn_of_mon(mon);
    if (bVar3 == '\0') {
      warning("display_warning did not match warning type?");
      return;
    }
    if (((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) ||
       ((u.umonnum != u.umonster && (bVar3 = dmgtype(youmonst.data,0x24), bVar3 != '\0')))) {
      local_28 = (int)mon->mnum;
    }
    else {
      local_28 = display_rng(0x193);
    }
    local_20 = local_28 + 1;
    local_24 = 0;
  }
  else {
    if (5 < (uint)mflag) {
      mflag = 5;
    }
    if (((u.uprops[0x23].intrinsic != 0) && (u.uprops[0x24].extrinsic == 0)) &&
       ((u.umonnum == u.umonster || (bVar3 = dmgtype(youmonst.data,0x24), bVar3 == '\0')))) {
      iVar4 = rn2(5);
      mflag = iVar4 + 1;
    }
    local_20 = mflag + 0x194;
    local_24 = 8;
  }
  dbuf_set(level,(int)cVar1,(int)cVar2,(rm *)0x0,-1,-1,-1,-1,-1,-1,0,local_20,local_24,0);
  return;
}

Assistant:

static void display_warning(struct monst *mon)
{
    int x = mon->mx, y = mon->my;
    int wl = (int) (mon->m_lev / 4);
    int monnum, mflag;

    if (mon_warning(mon)) {
        if (wl > WARNCOUNT - 1) wl = WARNCOUNT - 1;
	/* 3.4.1: this really ought to be rn2(WARNCOUNT), but value "0"
	   isn't handled correctly by the what_is routine so avoid it */
	if (Hallucination)
	    wl = rn1(WARNCOUNT-1,1);
	monnum = 1 + NUMMONS + wl;
        mflag = MON_WARNING;
    } else if (match_warn_of_mon(mon)) {
	monnum = dbuf_monid(mon);
	mflag = 0;
    } else {
	warning("display_warning did not match warning type?");
	return;
    }

    dbuf_set(level, x, y, NULL, -1, -1, -1, -1, -1, -1, 0, monnum, mflag, 0);
}